

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O3

void __thiscall
amrex::FaceDivFree::interp_arr
          (FaceDivFree *this,Array<FArrayBox_*,_3> *crse,int crse_comp,Array<FArrayBox_*,_3> *fine,
          int fine_comp,int ncomp,Box *fine_region,IntVect *ratio,Array<IArrayBox_*,_3> *solve_mask,
          Geometry *param_9,Geometry *fine_geom,
          Vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
          *param_11,int param_12,int param_13,RunOn runon)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  undefined8 uVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  int iVar40;
  int iVar41;
  long lVar42;
  long lVar43;
  int iVar44;
  long lVar45;
  long lVar46;
  int *piVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  int iVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  int iVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  bool bVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  Box result;
  int k_1;
  Box bx_2;
  Box bx_1;
  Box bx;
  Array<IndexType,_3> types;
  GpuArray<amrex::Array4<double>,_3U> finearr;
  GpuArray<amrex::Array4<const_double>,_3U> crsearr;
  GpuArray<amrex::Array4<const_int>,_3U> maskarr;
  long local_680;
  long local_678;
  long local_670;
  long local_668;
  long local_650;
  long local_648;
  undefined8 local_638;
  uint uStack_630;
  uint auStack_62c [2];
  undefined8 local_624;
  long local_5e0;
  long local_5d8;
  long local_5d0;
  long local_5c8;
  long local_5c0;
  long local_5b8;
  long local_5b0;
  ulong local_5a8;
  long local_568;
  long local_548;
  long local_538;
  long local_528;
  int local_508;
  int local_504;
  int local_500;
  int local_4fc;
  long local_4f8;
  double dStack_4f0;
  int *local_4e8;
  long local_4d8;
  undefined8 uStack_4d0;
  long local_4a8;
  long local_498;
  undefined8 uStack_490;
  double dStack_460;
  uint local_44c [2];
  undefined8 uStack_444;
  uint local_42c [2];
  undefined8 uStack_424;
  uint local_40c [2];
  undefined8 uStack_404;
  ulong local_3f8;
  uint local_3b8 [14];
  long local_380;
  long local_378;
  long local_370;
  undefined1 local_368 [8];
  undefined1 local_360 [8];
  undefined1 local_358 [8];
  undefined1 local_350 [8];
  undefined1 local_348 [8];
  undefined8 local_340;
  long local_338 [4];
  int local_318 [3];
  ulong uStack_30c;
  int aiStack_304 [3];
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  int local_2d8;
  int local_2d4;
  int local_2d0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  int local_298;
  int local_294;
  int local_290;
  undefined8 auStack_1dc [5];
  int iStack_1b4;
  undefined8 local_1b0;
  undefined8 local_1a8;
  long local_1a0 [2];
  int local_190 [3];
  ulong uStack_184;
  int aiStack_17c [3];
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  uint local_150;
  int local_14c;
  uint local_148;
  long local_130;
  long local_128;
  undefined1 local_120 [8];
  undefined1 local_118 [8];
  uint local_110;
  uint local_10c;
  int local_108;
  undefined8 auStack_104 [2];
  undefined4 uStack_f4;
  long local_f0 [4];
  int local_d0 [3];
  ulong uStack_c4;
  undefined4 auStack_bc [3];
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  int local_90;
  int local_8c;
  int local_88;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  int local_50;
  int local_4c;
  int local_48;
  
  local_5a8 = CONCAT44(local_5a8._4_4_,ncomp);
  local_3b8[2] = 0;
  local_3b8[0] = 0;
  local_3b8[1] = 0;
  lVar42 = 0;
  do {
    local_3b8[lVar42] = local_3b8[lVar42] | 1 << ((byte)lVar42 & 0x1f);
    lVar42 = lVar42 + 1;
  } while (lVar42 != 3);
  if (((ratio->vect[0] == 2) && (ratio->vect[1] == 2)) && (ratio->vect[2] == 2)) {
    lVar42 = *(long *)(fine_region->smallend).vect;
    uVar21 = *(undefined8 *)(fine_region->bigend).vect;
    uStack_630 = (uint)*(undefined8 *)((fine_region->smallend).vect + 2);
    auStack_62c[0] = (uint)uVar21;
    auStack_62c[1] = (uint)((ulong)uVar21 >> 0x20);
    local_624 = *(undefined8 *)((fine_region->bigend).vect + 2);
    iVar44 = 2;
    local_638._0_4_ = (uint)lVar42;
LAB_0059b09d:
    local_638 = lVar42;
    bVar68 = (int)(uint)local_638 < 0;
    if (bVar68) {
      uVar28 = (int)(uint)local_638 >> 1;
    }
    else {
      uVar28 = (uint)local_638 >> 1;
    }
    iVar40 = 2;
    lVar42 = local_638;
LAB_0059b15e:
    local_638 = lVar42;
    lVar42 = local_638;
    local_638 = CONCAT44(local_638._4_4_,uVar28);
    uVar28 = local_638._4_4_;
    if (iVar44 != 1) {
      if (iVar44 == 4) {
        if (lVar42 < 0) {
          uVar28 = (int)local_638._4_4_ >> 2;
        }
        else {
          uVar28 = local_638._4_4_ >> 2;
        }
        iVar44 = 4;
      }
      else if (iVar44 == 2) {
        if (lVar42 < 0) {
          uVar28 = (int)local_638._4_4_ >> 1;
        }
        else {
          uVar28 = local_638._4_4_ >> 1;
        }
        iVar44 = 2;
      }
      else if (lVar42 < 0) {
        uVar28 = ~((int)~local_638._4_4_ / iVar44);
      }
      else {
        uVar28 = (int)local_638._4_4_ / iVar44;
      }
    }
  }
  else {
    Assert_host("ratio == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/AmrCore/AMReX_Interpolater.cpp"
                ,0x3a5,(char *)0x0);
    iVar40 = ratio->vect[0];
    iVar44 = ratio->vect[1];
    lVar42 = *(long *)(fine_region->smallend).vect;
    uVar21 = *(undefined8 *)((fine_region->smallend).vect + 2);
    auStack_62c[1] = (uint)((ulong)*(undefined8 *)(fine_region->bigend).vect >> 0x20);
    local_624 = *(undefined8 *)((fine_region->bigend).vect + 2);
    uStack_630 = (uint)uVar21;
    auStack_62c[0] = (uint)((ulong)uVar21 >> 0x20);
    if (iVar44 != 1 || iVar40 != 1) {
      local_638._0_4_ = (uint)lVar42;
      uVar28 = (uint)local_638;
      if (iVar40 != 1) {
        if (iVar40 == 4) {
          if ((int)(uint)local_638 < 0) {
            uVar28 = (int)(uint)local_638 >> 2;
          }
          else {
            uVar28 = (uint)local_638 >> 2;
          }
          iVar40 = 4;
        }
        else {
          if (iVar40 == 2) goto LAB_0059b09d;
          if ((int)(uint)local_638 < 0) {
            uVar28 = ~((int)~(uint)local_638 / iVar40);
          }
          else {
            uVar28 = (int)(uint)local_638 / iVar40;
          }
        }
      }
      goto LAB_0059b15e;
    }
    local_638 = lVar42;
    if (ratio->vect[2] == 1) goto LAB_0059b3ca;
    iVar40 = 1;
    local_638._4_4_ = (uint)((ulong)lVar42 >> 0x20);
    iVar44 = 1;
    uVar28 = local_638._4_4_;
  }
  local_638 = CONCAT44(uVar28,(uint)local_638);
  iVar51 = ratio->vect[2];
  if (iVar51 != 1) {
    if (iVar51 == 4) {
      if ((int)uStack_630 < 0) {
        uStack_630 = (int)uStack_630 >> 2;
      }
      else {
        uStack_630 = uStack_630 >> 2;
      }
    }
    else if (iVar51 == 2) {
      if ((int)uStack_630 < 0) {
        uStack_630 = (int)uStack_630 >> 1;
      }
      else {
        uStack_630 = uStack_630 >> 1;
      }
    }
    else if ((int)uStack_630 < 0) {
      uStack_630 = ~((int)~uStack_630 / iVar51);
    }
    else {
      uStack_630 = (int)uStack_630 / iVar51;
    }
  }
  if (local_624._4_4_ == 0) {
    uVar28 = auStack_62c[0];
    if (iVar40 != 1) {
      if (iVar40 == 4) {
        uVar28 = (int)auStack_62c[0] >> 2;
        if (-1 < (int)auStack_62c[0]) {
          uVar28 = auStack_62c[0] >> 2;
        }
      }
      else if (iVar40 == 2) {
        uVar28 = (int)auStack_62c[0] >> 1;
        if (-1 < (int)auStack_62c[0]) {
          uVar28 = auStack_62c[0] >> 1;
        }
      }
      else if ((int)auStack_62c[0] < 0) {
        uVar28 = ~((int)~auStack_62c[0] / iVar40);
      }
      else {
        uVar28 = (int)auStack_62c[0] / iVar40;
      }
    }
    auStack_62c[0] = uVar28;
    uVar28 = auStack_62c[1];
    if (iVar44 != 1) {
      if (iVar44 == 4) {
        uVar28 = (int)auStack_62c[1] >> 2;
        if (-1 < (int)auStack_62c[1]) {
          uVar28 = auStack_62c[1] >> 2;
        }
      }
      else if (iVar44 == 2) {
        uVar28 = (int)auStack_62c[1] >> 1;
        if (-1 < (int)auStack_62c[1]) {
          uVar28 = auStack_62c[1] >> 1;
        }
      }
      else if ((int)auStack_62c[1] < 0) {
        uVar28 = ~((int)~auStack_62c[1] / iVar44);
      }
      else {
        uVar28 = (int)auStack_62c[1] / iVar44;
      }
    }
    auStack_62c[1] = uVar28;
    uVar28 = (uint)local_624;
    if (iVar51 != 1) {
      if (iVar51 == 4) {
        uVar28 = (int)(uint)local_624 >> 2;
        if (-1 < (int)(uint)local_624) {
          uVar28 = (uint)local_624 >> 2;
        }
      }
      else if (iVar51 == 2) {
        uVar28 = (int)(uint)local_624 >> 1;
        if (-1 < (int)(uint)local_624) {
          uVar28 = (uint)local_624 >> 1;
        }
      }
      else if ((int)(uint)local_624 < 0) {
        uVar28 = ~((int)~(uint)local_624 / iVar51);
      }
      else {
        uVar28 = (int)(uint)local_624 / iVar51;
      }
    }
  }
  else {
    local_1b0 = 0;
    local_1a8._0_4_ = 0;
    lVar42 = 0;
    do {
      if (((local_624._4_4_ >> ((uint)lVar42 & 0x1f) & 1) != 0) &&
         ((int)auStack_62c[lVar42] % ratio->vect[lVar42] != 0)) {
        *(undefined4 *)((long)&local_1b0 + lVar42 * 4) = 1;
      }
      lVar42 = lVar42 + 1;
    } while (lVar42 != 3);
    uVar28 = auStack_62c[0];
    if (iVar40 != 1) {
      if (iVar40 == 4) {
        uVar28 = (int)auStack_62c[0] >> 2;
        if (-1 < (int)auStack_62c[0]) {
          uVar28 = auStack_62c[0] >> 2;
        }
      }
      else if (iVar40 == 2) {
        uVar28 = (int)auStack_62c[0] >> 1;
        if (-1 < (int)auStack_62c[0]) {
          uVar28 = auStack_62c[0] >> 1;
        }
      }
      else if ((int)auStack_62c[0] < 0) {
        uVar28 = ~((int)~auStack_62c[0] / iVar40);
      }
      else {
        uVar28 = (int)auStack_62c[0] / iVar40;
      }
    }
    uVar49 = auStack_62c[1];
    if (iVar44 != 1) {
      if (iVar44 == 4) {
        uVar49 = (int)auStack_62c[1] >> 2;
        if (-1 < (int)auStack_62c[1]) {
          uVar49 = auStack_62c[1] >> 2;
        }
      }
      else if (iVar44 == 2) {
        uVar49 = (int)auStack_62c[1] >> 1;
        if (-1 < (int)auStack_62c[1]) {
          uVar49 = auStack_62c[1] >> 1;
        }
      }
      else if ((int)auStack_62c[1] < 0) {
        uVar49 = ~((int)~auStack_62c[1] / iVar44);
      }
      else {
        uVar49 = (int)auStack_62c[1] / iVar44;
      }
    }
    uVar50 = (uint)local_624;
    if (iVar51 != 1) {
      if (iVar51 == 4) {
        uVar50 = (int)(uint)local_624 >> 2;
        if (-1 < (int)(uint)local_624) {
          uVar50 = (uint)local_624 >> 2;
        }
      }
      else if (iVar51 == 2) {
        uVar50 = (int)(uint)local_624 >> 1;
        if (-1 < (int)(uint)local_624) {
          uVar50 = (uint)local_624 >> 1;
        }
      }
      else if ((int)(uint)local_624 < 0) {
        uVar50 = ~((int)~(uint)local_624 / iVar51);
      }
      else {
        uVar50 = (int)(uint)local_624 / iVar51;
      }
    }
    auStack_62c[0] = uVar28 + (int)local_1b0;
    auStack_62c[1] = uVar49 + local_1b0._4_4_;
    uVar28 = uVar50 + (int)local_1a8;
  }
  local_624 = CONCAT44(local_624._4_4_,uVar28);
LAB_0059b3ca:
  dVar79 = (fine_geom->super_CoordSys).dx[0];
  dVar69 = (fine_geom->super_CoordSys).dx[1];
  dVar86 = (fine_geom->super_CoordSys).dx[2];
  lVar42 = 0x2c;
  do {
    *(undefined8 *)((long)auStack_1dc + lVar42 + 0x10) = 0;
    *(undefined8 *)((long)auStack_1dc + lVar42 + 0x18) = 0;
    *(undefined8 *)((long)auStack_1dc + lVar42) = 0;
    *(undefined8 *)((long)auStack_1dc + lVar42 + 8) = 0;
    *(undefined8 *)((long)auStack_1dc + lVar42 + 0x20) = 0x100000001;
    *(undefined4 *)((long)&iStack_1b4 + lVar42) = 1;
    *(undefined8 *)((long)&local_1b0 + lVar42) = 0;
    *(undefined8 *)((long)&local_1a8 + lVar42) = 0;
    lVar42 = lVar42 + 0x40;
  } while (lVar42 != 0xec);
  lVar42 = 0x2c;
  do {
    *(undefined8 *)(local_358 + lVar42 + 4) = 0;
    *(undefined8 *)(local_350 + lVar42 + 4) = 0;
    *(undefined8 *)(local_368 + lVar42 + 4) = 0;
    *(undefined8 *)(local_360 + lVar42 + 4) = 0;
    *(undefined8 *)(local_348 + lVar42 + 4) = 0x100000001;
    *(undefined4 *)((long)&local_340 + lVar42 + 4) = 1;
    *(undefined8 *)((long)local_338 + lVar42) = 0;
    *(undefined8 *)((long)local_338 + lVar42 + 8) = 0;
    lVar42 = lVar42 + 0x40;
  } while (lVar42 != 0xec);
  lVar42 = 0x2c;
  do {
    *(undefined8 *)((long)&local_10c + lVar42) = 0;
    *(undefined8 *)((long)auStack_104 + lVar42) = 0;
    *(undefined8 *)(local_120 + lVar42 + 4) = 0;
    *(undefined8 *)(local_118 + lVar42 + 4) = 0;
    *(undefined8 *)((long)auStack_104 + lVar42 + 8) = 0x100000001;
    *(undefined4 *)((long)&uStack_f4 + lVar42) = 1;
    *(undefined8 *)((long)local_f0 + lVar42) = 0;
    *(undefined8 *)((long)local_f0 + lVar42 + 8) = 0;
    lVar42 = lVar42 + 0x40;
  } while (lVar42 != 0xec);
  lVar42 = (long)crse_comp;
  lVar30 = (long)fine_comp;
  lVar31 = 0;
  do {
    lVar43 = *(long *)((long)crse->_M_elems + lVar31);
    iVar40 = *(int *)(lVar43 + 0x20);
    uVar21 = *(undefined8 *)(lVar43 + 0x18);
    lVar52 = (long)*(int *)(lVar43 + 0x28) + 1;
    iVar44 = *(int *)(lVar43 + 0x24);
    lVar58 = (long)*(int *)(lVar43 + 0x2c) + 1;
    lVar46 = ((long)iVar44 - (long)*(int *)(lVar43 + 0x18)) + 1;
    lVar53 = (lVar52 - *(int *)(lVar43 + 0x1c)) * lVar46;
    lVar54 = (lVar58 - iVar40) * lVar53;
    iVar51 = *(int *)(lVar43 + 0x34);
    (&local_1b0)[lVar31] = lVar54 * lVar42 * 8 + *(long *)(lVar43 + 0x10);
    (&local_1a8)[lVar31] = lVar46;
    local_1a0[lVar31] = lVar53;
    local_1a0[lVar31 + 1] = lVar54;
    *(undefined8 *)(local_190 + lVar31 * 2) = uVar21;
    local_190[lVar31 * 2 + 2] = iVar40;
    (&uStack_184)[lVar31] = (ulong)(iVar44 + 1) | lVar52 << 0x20;
    aiStack_17c[lVar31 * 2] = (int)lVar58;
    aiStack_17c[lVar31 * 2 + 1] = iVar51 - crse_comp;
    lVar43 = *(long *)((long)fine->_M_elems + lVar31);
    iVar40 = *(int *)(lVar43 + 0x20);
    uVar21 = *(undefined8 *)(lVar43 + 0x18);
    lVar52 = (long)*(int *)(lVar43 + 0x28) + 1;
    iVar44 = *(int *)(lVar43 + 0x24);
    lVar58 = (long)*(int *)(lVar43 + 0x2c) + 1;
    lVar46 = ((long)iVar44 - (long)*(int *)(lVar43 + 0x18)) + 1;
    lVar53 = (lVar52 - *(int *)(lVar43 + 0x1c)) * lVar46;
    lVar54 = (lVar58 - iVar40) * lVar53;
    iVar51 = *(int *)(lVar43 + 0x34);
    local_338[lVar31] = lVar54 * lVar30 * 8 + *(long *)(lVar43 + 0x10);
    local_338[lVar31 + 1] = lVar46;
    local_338[lVar31 + 2] = lVar53;
    local_338[lVar31 + 3] = lVar54;
    *(undefined8 *)(local_318 + lVar31 * 2) = uVar21;
    local_318[lVar31 * 2 + 2] = iVar40;
    (&uStack_30c)[lVar31] = (ulong)(iVar44 + 1) | lVar52 << 0x20;
    aiStack_304[lVar31 * 2] = (int)lVar58;
    aiStack_304[lVar31 * 2 + 1] = iVar51 - fine_comp;
    lVar43 = *(long *)((long)solve_mask->_M_elems + lVar31);
    if (lVar43 != 0) {
      uVar13 = *(undefined4 *)(lVar43 + 0x34);
      iVar40 = *(int *)(lVar43 + 0x20);
      uVar21 = *(undefined8 *)(lVar43 + 0x18);
      lVar46 = (long)*(int *)(lVar43 + 0x28) + 1;
      iVar44 = *(int *)(lVar43 + 0x24);
      lVar53 = (long)*(int *)(lVar43 + 0x2c) + 1;
      lVar54 = ((long)iVar44 - (long)*(int *)(lVar43 + 0x18)) + 1;
      lVar52 = (lVar46 - *(int *)(lVar43 + 0x1c)) * lVar54;
      local_f0[lVar31] = *(long *)(lVar43 + 0x10);
      local_f0[lVar31 + 1] = lVar54;
      local_f0[lVar31 + 2] = lVar52;
      local_f0[lVar31 + 3] = (lVar53 - iVar40) * lVar52;
      *(undefined8 *)(local_d0 + lVar31 * 2) = uVar21;
      local_d0[lVar31 * 2 + 2] = iVar40;
      (&uStack_c4)[lVar31] = (ulong)(iVar44 + 1) | lVar46 << 0x20;
      auStack_bc[lVar31 * 2] = (int)lVar53;
      auStack_bc[lVar31 * 2 + 1] = uVar13;
    }
    lVar31 = lVar31 + 8;
  } while (lVar31 != 0x18);
  local_40c[1] = auStack_62c[1];
  uStack_404 = local_624;
  uVar21 = uStack_404;
  local_40c[0] = auStack_62c[0];
  lVar31 = 0;
  uStack_404._4_4_ = (uint)((ulong)local_624 >> 0x20);
  uVar28 = uStack_404._4_4_;
  uVar49 = uStack_404._4_4_;
  uStack_404 = uVar21;
  do {
    uVar48 = 1 << ((byte)lVar31 & 0x1f);
    uVar50 = (uint)lVar31;
    local_40c[lVar31] =
         (local_40c[lVar31] + (uint)((local_3b8[0] >> (uVar50 & 0x1f) & 1) != 0)) -
         (uint)((uVar49 >> (uVar50 & 0x1f) & 1) != 0);
    if ((local_3b8[0] >> (uVar50 & 0x1f) & 1) == 0) {
      uVar49 = ~uVar48 & uStack_404._4_4_;
    }
    else {
      uVar49 = uVar48 | uStack_404._4_4_;
    }
    uStack_404 = CONCAT44(uVar49,(int)uStack_404);
    lVar31 = lVar31 + 1;
  } while (lVar31 != 3);
  local_42c[1] = auStack_62c[1];
  uStack_424 = local_624;
  local_42c[0] = auStack_62c[0];
  lVar31 = 0;
  uVar49 = uVar28;
  do {
    uVar48 = 1 << ((byte)lVar31 & 0x1f);
    uVar50 = (uint)lVar31;
    local_42c[lVar31] =
         (local_42c[lVar31] + (uint)((local_3b8[1] >> (uVar50 & 0x1f) & 1) != 0)) -
         (uint)((uVar49 >> (uVar50 & 0x1f) & 1) != 0);
    if ((local_3b8[1] >> (uVar50 & 0x1f) & 1) == 0) {
      uVar49 = ~uVar48 & uStack_424._4_4_;
    }
    else {
      uVar49 = uVar48 | uStack_424._4_4_;
    }
    uStack_424 = CONCAT44(uVar49,(int)uStack_424);
    lVar31 = lVar31 + 1;
  } while (lVar31 != 3);
  local_44c[1] = auStack_62c[1];
  uStack_444 = local_624;
  local_44c[0] = auStack_62c[0];
  lVar31 = 0;
  do {
    uVar50 = 1 << ((byte)lVar31 & 0x1f);
    uVar49 = (uint)lVar31;
    local_44c[lVar31] =
         (local_44c[lVar31] + (uint)((local_3b8[2] >> (uVar49 & 0x1f) & 1) != 0)) -
         (uint)((uVar28 >> (uVar49 & 0x1f) & 1) != 0);
    if ((local_3b8[2] >> (uVar49 & 0x1f) & 1) == 0) {
      uVar28 = ~uVar50 & uStack_444._4_4_;
    }
    else {
      uVar28 = uVar50 | uStack_444._4_4_;
    }
    uStack_444 = CONCAT44(uVar28,(int)uStack_444);
    lVar31 = lVar31 + 1;
  } while (lVar31 != 3);
  local_680 = (long)(int)uStack_630;
  uVar32 = local_5a8 & 0xffffffff;
  if ((int)uStack_630 <= (int)uStack_404) {
    lVar52 = (long)(int)(uint)local_638;
    lVar43 = local_1a0[1] * lVar42 * 8 + (long)local_190[0] * -8 + local_1b0;
    lVar31 = local_1a0[0] * 8;
    lVar53 = CONCAT44(local_1a8._4_4_,(int)local_1a8) * 8;
    lVar46 = local_1a0[1] * 8;
    do {
      if ((int)local_638._4_4_ <= (int)local_40c[1]) {
        iVar40 = (int)local_680;
        lVar54 = ((iVar40 + 1) - local_190[2]) * lVar31 + lVar43;
        lVar59 = (local_680 - local_190[2]) * lVar31 + lVar43;
        lVar58 = (~local_190[2] + iVar40) * lVar31 + lVar43;
        local_678 = (long)(int)local_638._4_4_;
        do {
          if ((int)(uint)local_638 <= (int)local_40c[0]) {
            local_4e8 = (int *)((local_678 - local_d0[1]) * local_f0[1] * 4 +
                               (local_680 - local_d0[2]) * local_f0[2] * 4 +
                               lVar52 * 4 + local_f0[3] * lVar42 * 4 + (long)local_d0[0] * -4 +
                               local_f0[0]);
            iVar44 = (int)local_678;
            local_548 = ((iVar44 + 1) - local_190[1]) * lVar53;
            local_498 = lVar54 + local_548;
            local_5b0 = lVar59 + local_548;
            local_548 = local_548 + lVar58;
            lVar62 = (local_678 - local_190[1]) * lVar53;
            local_5b8 = lVar54 + lVar62;
            local_4a8 = lVar59 + lVar62;
            local_4f8 = lVar62 + lVar58;
            local_568 = (~local_190[1] + iVar44) * lVar53;
            local_5c0 = lVar54 + local_568;
            local_538 = lVar59 + local_568;
            local_568 = local_568 + lVar58;
            local_648 = lVar52;
            do {
              if (0 < (int)local_5a8) {
                lVar62 = (long)local_318[0];
                iVar51 = ratio->vect[1] * iVar44 - local_318[1];
                iVar29 = ratio->vect[2] * iVar40 - local_318[2];
                lVar60 = (long)(ratio->vect[0] * (int)local_648);
                lVar64 = lVar30 * 8 * local_338[3];
                lVar55 = (long)(iVar29 + 1) * local_338[2] * 8 + lVar64;
                lVar66 = (long)(iVar51 + 1) * local_338[1] * 8;
                local_668 = lVar66 + lVar55 + lVar62 * -8 + local_338[0];
                lVar65 = local_338[3] * 8;
                lVar64 = local_338[2] * 8 * (long)iVar29 + lVar64;
                local_4d8 = lVar66 + lVar64 + lVar62 * -8 + local_338[0];
                lVar66 = local_338[1] * 8 * (long)iVar51;
                lVar63 = lVar55 + lVar66 + lVar62 * -8 + local_338[0];
                lVar56 = lVar66 + lVar64 + lVar62 * -8 + local_338[0];
                lVar62 = local_498;
                lVar64 = local_568;
                lVar66 = local_538;
                piVar47 = local_4e8;
                lVar55 = local_5b0;
                lVar39 = local_4a8;
                lVar34 = local_5c0;
                lVar35 = local_4f8;
                lVar36 = local_5b8;
                lVar45 = local_548;
                uVar33 = uVar32;
                do {
                  if ((local_f0[0] == 0) || (*piVar47 != 0)) {
                    dVar82 = *(double *)(lVar64 + lVar52 * 8);
                    dVar75 = *(double *)(lVar66 + lVar52 * 8);
                    dVar85 = *(double *)(lVar34 + lVar52 * 8);
                    dVar19 = *(double *)(lVar35 + lVar52 * 8);
                    dVar92 = *(double *)(lVar36 + lVar52 * 8);
                    dVar72 = *(double *)(lVar45 + lVar52 * 8);
                    dVar77 = *(double *)(lVar55 + lVar52 * 8);
                    dVar78 = *(double *)(lVar62 + lVar52 * 8);
                    dVar80 = *(double *)(lVar39 + lVar52 * 8) * 64.0;
                    dVar81 = ((dVar82 + dVar78) - dVar72) - dVar85;
                    *(double *)(lVar56 + lVar60 * 8) =
                         ((((dVar75 + dVar19) - dVar77) - dVar92) * 8.0 + dVar80 + dVar81) *
                         0.015625;
                    dVar78 = ((dVar85 + dVar72) - dVar82) - dVar78;
                    *(double *)(lVar63 + lVar60 * 8) =
                         ((((dVar75 + dVar92) - dVar77) - dVar19) * 8.0 + dVar80 + dVar78) *
                         0.015625;
                    *(double *)(local_4d8 + lVar60 * 8) =
                         ((((dVar19 + dVar77) - dVar75) - dVar92) * 8.0 + dVar80 + dVar78) *
                         0.015625;
                    *(double *)(local_668 + lVar60 * 8) =
                         ((((dVar92 + dVar77) - dVar75) - dVar19) * 8.0 + dVar80 + dVar81) *
                         0.015625;
                  }
                  local_668 = local_668 + lVar65;
                  local_4d8 = local_4d8 + lVar65;
                  lVar63 = lVar63 + lVar65;
                  lVar56 = lVar56 + lVar65;
                  piVar47 = piVar47 + local_f0[3];
                  lVar62 = lVar62 + lVar46;
                  lVar55 = lVar55 + lVar46;
                  lVar45 = lVar45 + lVar46;
                  lVar36 = lVar36 + lVar46;
                  lVar39 = lVar39 + lVar46;
                  lVar35 = lVar35 + lVar46;
                  lVar34 = lVar34 + lVar46;
                  lVar66 = lVar66 + lVar46;
                  lVar64 = lVar64 + lVar46;
                  uVar33 = uVar33 - 1;
                } while (uVar33 != 0);
              }
              local_648 = local_648 + 1;
              local_4e8 = local_4e8 + 1;
              local_498 = local_498 + 8;
              local_5b0 = local_5b0 + 8;
              local_548 = local_548 + 8;
              local_5b8 = local_5b8 + 8;
              local_4a8 = local_4a8 + 8;
              local_4f8 = local_4f8 + 8;
              local_5c0 = local_5c0 + 8;
              local_538 = local_538 + 8;
              local_568 = local_568 + 8;
            } while (local_40c[0] + 1 != (int)local_648);
          }
          local_678 = local_678 + 1;
        } while ((int)local_678 != local_40c[1] + 1);
      }
      local_680 = local_680 + 1;
    } while ((int)local_680 != (int)uStack_404 + 1);
  }
  local_548 = (long)(int)uStack_630;
  if ((int)uStack_630 <= (int)uStack_424) {
    lVar43 = (long)(int)local_638._4_4_;
    lVar31 = local_160 * 8;
    lVar46 = (long)(int)local_150 * -8;
    do {
      if ((int)local_638._4_4_ <= (int)local_42c[1]) {
        local_4e8 = (int *)((local_548 - local_88) * local_a0 * 4 +
                           local_98 * lVar42 * 4 + (lVar43 - local_8c) * local_a8 * 4 +
                           (long)local_90 * -4 + local_b0);
        iVar40 = (int)local_548;
        lVar52 = (int)((iVar40 + 1) - local_148) * lVar31;
        lVar54 = (local_548 - (int)local_148) * lVar31;
        lVar53 = (int)(~local_148 + iVar40) * lVar31;
        local_4f8 = lVar43;
        local_568 = local_158 * lVar42 * 8 + (lVar43 - local_14c) * local_168 * 8 + local_170;
        do {
          lVar58 = (long)(int)(uint)local_638;
          if ((int)(uint)local_638 <= (int)local_42c[0]) {
            do {
              iVar44 = (int)lVar58;
              if (0 < (int)local_5a8) {
                iVar29 = ratio->vect[0] * iVar44;
                lVar62 = (long)(int)(~local_150 + iVar44);
                lVar55 = (long)(int)((iVar44 + 1) - local_150);
                iVar51 = ratio->vect[2] * iVar40 - local_2d0;
                lVar39 = (long)((iVar29 - local_2d8) + 1);
                lVar34 = (long)(iVar51 + 1) * local_2e8 * 8;
                lVar66 = lVar30 * 8 * local_2e0 +
                         ((long)(ratio->vect[1] * (int)local_4f8) - (long)local_2d4) * local_2f0 * 8
                         + local_2f8;
                lVar64 = local_2e8 * 8 * (long)iVar51;
                piVar47 = (int *)((long)local_4e8 + lVar58 * 4);
                lVar59 = local_568;
                uVar33 = uVar32;
                do {
                  if ((local_b0 == 0) || (*piVar47 != 0)) {
                    dVar82 = *(double *)(lVar59 + lVar53 + lVar62 * 8);
                    dVar75 = *(double *)(lVar59 + lVar46 + lVar53 + lVar58 * 8);
                    dVar85 = *(double *)(lVar59 + lVar53 + lVar55 * 8);
                    dVar19 = *(double *)(lVar59 + lVar54 + lVar62 * 8);
                    dVar92 = *(double *)(lVar59 + lVar54 + lVar55 * 8);
                    dVar72 = *(double *)(lVar59 + lVar52 + lVar62 * 8);
                    dVar77 = *(double *)(lVar59 + lVar52 + lVar46 + lVar58 * 8);
                    dVar78 = *(double *)(lVar59 + lVar55 * 8 + lVar52);
                    dVar80 = *(double *)(lVar59 + lVar46 + lVar54 + lVar58 * 8) * 64.0;
                    dVar81 = ((dVar82 + dVar78) - dVar72) - dVar85;
                    *(double *)(lVar66 + lVar64 + (long)iVar29 * 8 + (long)local_2d8 * -8) =
                         ((((dVar75 + dVar19) - dVar77) - dVar92) * 8.0 + dVar80 + dVar81) *
                         0.015625;
                    dVar78 = ((dVar85 + dVar72) - dVar82) - dVar78;
                    *(double *)(lVar66 + lVar64 + lVar39 * 8) =
                         ((((dVar75 + dVar92) - dVar77) - dVar19) * 8.0 + dVar80 + dVar78) *
                         0.015625;
                    *(double *)(lVar66 + lVar34 + (long)iVar29 * 8 + (long)local_2d8 * -8) =
                         ((((dVar19 + dVar77) - dVar75) - dVar92) * 8.0 + dVar80 + dVar78) *
                         0.015625;
                    *(double *)(lVar66 + lVar34 + lVar39 * 8) =
                         ((((dVar92 + dVar77) - dVar75) - dVar19) * 8.0 + dVar80 + dVar81) *
                         0.015625;
                  }
                  lVar66 = lVar66 + local_2e0 * 8;
                  piVar47 = piVar47 + local_98;
                  lVar59 = lVar59 + local_158 * 8;
                  uVar33 = uVar33 - 1;
                } while (uVar33 != 0);
              }
              lVar58 = lVar58 + 1;
            } while (iVar44 + 1 != local_42c[0] + 1);
          }
          lVar58 = local_4f8 + 1;
          local_4e8 = (int *)((long)local_4e8 + local_a8 * 4);
          local_568 = local_568 + local_168 * 8;
          local_4f8 = lVar58;
        } while (local_42c[1] + 1 != (int)lVar58);
      }
      local_548 = local_548 + 1;
    } while ((int)local_548 != (int)uStack_424 + 1);
  }
  local_538 = (long)(int)uStack_630;
  if ((int)uStack_630 <= (int)uStack_444) {
    local_650 = local_58 * lVar42 * 4 + (local_538 - local_48) * local_60 * 4 + (long)local_50 * -4
                + local_70;
    local_670 = lVar42 * (long)local_118 * 8 + (local_538 - local_108) * (long)local_120 * 8 +
                local_130;
    lVar42 = local_128 * 8;
    lVar31 = (long)(int)local_110 * -8;
    do {
      local_568 = (long)(int)local_638._4_4_;
      if ((int)local_638._4_4_ <= (int)local_44c[1]) {
        do {
          if ((int)(uint)local_638 <= (int)local_44c[0]) {
            iVar40 = (int)local_568;
            lVar46 = (int)((iVar40 + 1) - local_10c) * lVar42;
            lVar53 = (local_568 - (int)local_10c) * lVar42;
            lVar52 = (int)(~local_10c + iVar40) * lVar42;
            lVar43 = (long)(int)(uint)local_638;
            do {
              iVar44 = (int)lVar43;
              if (0 < (int)local_5a8) {
                iVar29 = ratio->vect[0] * iVar44;
                lVar58 = (long)(int)(~local_110 + iVar44);
                lVar64 = (long)(int)((iVar44 + 1) - local_110);
                iVar51 = ratio->vect[1] * iVar40 - local_294;
                lVar66 = (long)((iVar29 - local_298) + 1);
                lVar55 = (long)(iVar51 + 1) * local_2b0 * 8;
                lVar62 = lVar30 * 8 * local_2a0 +
                         ((long)(ratio->vect[2] * (int)local_538) - (long)local_290) * local_2a8 * 8
                         + local_2b8;
                lVar59 = local_2b0 * 8 * (long)iVar51;
                piVar47 = (int *)((local_568 - local_4c) * local_68 * 4 + local_650 + lVar43 * 4);
                uVar33 = uVar32;
                lVar54 = local_670;
                do {
                  if ((local_70 == 0) || (*piVar47 != 0)) {
                    dVar82 = *(double *)(lVar54 + lVar52 + lVar58 * 8);
                    dVar75 = *(double *)(lVar54 + lVar31 + lVar52 + lVar43 * 8);
                    dVar85 = *(double *)(lVar54 + lVar52 + lVar64 * 8);
                    dVar19 = *(double *)(lVar54 + lVar53 + lVar58 * 8);
                    dVar92 = *(double *)(lVar54 + lVar53 + lVar64 * 8);
                    dVar72 = *(double *)(lVar54 + lVar46 + lVar58 * 8);
                    dVar77 = *(double *)(lVar54 + lVar46 + lVar31 + lVar43 * 8);
                    dVar78 = *(double *)(lVar54 + lVar46 + lVar64 * 8);
                    dVar80 = *(double *)(lVar54 + lVar31 + lVar53 + lVar43 * 8) * 64.0;
                    dVar81 = ((dVar82 + dVar78) - dVar72) - dVar85;
                    *(double *)(lVar62 + lVar59 + (long)iVar29 * 8 + (long)local_298 * -8) =
                         ((((dVar75 + dVar19) - dVar77) - dVar92) * 8.0 + dVar80 + dVar81) *
                         0.015625;
                    dVar78 = ((dVar85 + dVar72) - dVar82) - dVar78;
                    *(double *)(lVar62 + lVar59 + lVar66 * 8) =
                         ((((dVar75 + dVar92) - dVar77) - dVar19) * 8.0 + dVar80 + dVar78) *
                         0.015625;
                    *(double *)(lVar62 + lVar55 + (long)iVar29 * 8 + (long)local_298 * -8) =
                         ((((dVar19 + dVar77) - dVar75) - dVar92) * 8.0 + dVar80 + dVar78) *
                         0.015625;
                    *(double *)(lVar62 + lVar55 + lVar66 * 8) =
                         ((((dVar92 + dVar77) - dVar75) - dVar19) * 8.0 + dVar80 + dVar81) *
                         0.015625;
                  }
                  lVar62 = lVar62 + local_2a0 * 8;
                  piVar47 = piVar47 + local_58;
                  lVar54 = lVar54 + (long)local_118 * 8;
                  uVar33 = uVar33 - 1;
                } while (uVar33 != 0);
              }
              lVar43 = lVar43 + 1;
            } while (iVar44 + 1 != local_44c[0] + 1);
          }
          local_568 = local_568 + 1;
        } while ((int)local_568 != local_44c[1] + 1);
      }
      local_538 = local_538 + 1;
      local_650 = local_650 + local_60 * 4;
      local_670 = local_670 + (long)local_120 * 8;
    } while ((int)uStack_444 + 1 != (int)local_538);
  }
  if (0 < (int)local_5a8) {
    iVar40 = ratio->vect[1];
    lVar66 = (long)iVar40;
    iVar44 = ratio->vect[0];
    lVar53 = (long)local_318[1];
    lVar54 = (int)local_638._4_4_ * lVar66;
    lVar42 = lVar54 + 1;
    lVar31 = local_2a0 * lVar30 * 8;
    lVar52 = (long)(int)(uint)local_638 * (long)iVar44;
    lVar46 = lVar31 + (lVar42 - local_294) * local_2b0 * 8 + lVar52 * 8 + (long)local_298 * -8;
    lVar31 = lVar31 + (lVar54 - local_294) * local_2b0 * 8 + lVar52 * 8 + (long)local_298 * -8;
    lVar43 = local_338[3] * lVar30 * 8;
    local_340 = local_2b8 + lVar46;
    local_348 = (undefined1  [8])(lVar46 + local_2b8 + 8);
    local_350 = (undefined1  [8])(local_2b8 + lVar31);
    local_358 = (undefined1  [8])(local_2b8 + lVar31 + 8);
    lVar31 = local_2e0 * lVar30 * 8;
    lVar46 = (long)local_2d8;
    local_360 = (undefined1  [8])
                (lVar31 + (lVar42 - local_2d4) * local_2f0 * 8 + lVar52 * 8 + lVar46 * -8 +
                local_2f8);
    local_368 = (undefined1  [8])(lVar31 + lVar46 * -8 + local_2f8 + 8);
    local_370 = lVar31 + (lVar54 - local_2d4) * local_2f0 * 8 + lVar52 * 8 + lVar46 * -8 + 8 +
                local_2f8;
    dVar80 = dVar79 * dVar79;
    dVar85 = dVar69 * dVar69;
    dVar92 = dVar86 * dVar86;
    dVar83 = (dVar86 + dVar86) * dVar86;
    dVar72 = dVar69 * 8.0 * (dVar92 + dVar80);
    dVar78 = dVar86 * 8.0 * (dVar80 + dVar85);
    dVar82 = (dVar69 + dVar69) * dVar69;
    dVar75 = dVar79 * 8.0 * (dVar85 + dVar92);
    dVar84 = (dVar79 + dVar79) * dVar79;
    dVar81 = ((dVar80 + dVar82) * dVar79) / dVar78;
    dVar89 = (dVar79 * dVar80) / dVar78;
    dVar77 = ((dVar83 + dVar85) * dVar69) / dVar75;
    dVar90 = (dVar69 * dVar85) / dVar75;
    dVar19 = ((dVar85 + dVar84) * dVar69) / dVar78;
    dVar78 = (dVar69 * dVar85) / dVar78;
    dVar69 = ((dVar82 + dVar92) * dVar86) / dVar75;
    dVar75 = (dVar86 * dVar92) / dVar75;
    dVar82 = ((dVar83 + dVar80) * dVar79) / dVar72;
    dVar79 = (dVar79 * dVar80) / dVar72;
    dVar85 = ((dVar84 + dVar92) * dVar86) / dVar72;
    dVar72 = (dVar86 * dVar92) / dVar72;
    auVar18._8_4_ = SUB84(dVar19,0);
    auVar18._0_8_ = dVar19;
    auVar18._12_4_ = (int)((ulong)dVar19 >> 0x20);
    lVar31 = local_2a0 * 8;
    lVar58 = local_2a8 * 8;
    iVar51 = uStack_630 * iVar40;
    lVar64 = local_2b0 * lVar66 * 8;
    lVar62 = local_2e0 * 8;
    lVar59 = local_2f0 * lVar66 * 8;
    local_378 = lVar43 + (lVar42 - lVar53) * local_338[1] * 8 + lVar52 * 8 + (long)local_318[0] * -8
                + local_338[0] + 8;
    lVar42 = -(long)local_318[2];
    lVar46 = local_338[1] * lVar66 * 8;
    local_380 = lVar43 + (lVar54 - lVar53) * local_338[1] * 8 + lVar52 * 8 + (long)local_318[0] * -8
                + local_338[0] + 8;
    local_3f8 = 0;
    do {
      if ((int)uStack_630 <= (int)(uint)local_624) {
        lVar43 = (local_3f8 + lVar30) * local_338[3];
        local_508 = (iVar51 - local_290) + 2;
        local_504 = iVar51 - local_290;
        local_500 = iVar51;
        local_4fc = iVar51 + 1;
        uVar28 = uStack_630;
        do {
          if ((int)local_638._4_4_ <= (int)auStack_62c[1]) {
            local_5e0 = local_340 + local_508 * lVar58;
            lVar34 = local_340 + local_504 * lVar58;
            lVar60 = (-(long)local_2d0 + (long)local_500) * local_2e8 * 8;
            lVar67 = local_508 * lVar58 + (long)local_350;
            local_650 = local_504 * lVar58 + (long)local_350;
            lVar55 = (long)local_4fc;
            lVar63 = (lVar42 + lVar55) * local_338[2] * 8;
            lVar54 = local_378 + lVar63;
            lVar65 = (local_500 + lVar42) * local_338[2] * 8;
            lVar35 = local_378 + lVar65;
            lVar63 = lVar63 + local_380;
            lVar65 = lVar65 + local_380;
            local_5d0 = (lVar55 - local_290) * lVar58;
            local_5c8 = (long)local_348 + local_5d0;
            local_5d0 = local_5d0 + (long)local_358;
            lVar56 = (lVar55 + -(long)local_2d0) * local_2e8 * 8;
            local_5d8 = local_370 + lVar56;
            lVar45 = ((long)(int)(uVar28 * iVar40) - (long)local_318[2]) * local_338[2];
            lVar36 = (int)((uVar28 * iVar40 - local_318[2]) + 1) * local_338[2];
            lVar55 = (long)local_360 + lVar56;
            local_670 = (long)local_360 + lVar60;
            lVar39 = local_370 + lVar60;
            local_528 = (long)(int)local_638._4_4_;
            iVar29 = (local_638._4_4_ * iVar40 - local_2d4) + 2;
            do {
              if ((int)(uint)local_638 <= (int)auStack_62c[0]) {
                lVar37 = iVar29 * local_2f0 + lVar52;
                lVar1 = lVar56 + (long)local_368 + lVar37 * 8;
                lVar37 = lVar60 + (long)local_368 + lVar37 * 8;
                lVar38 = local_528 * lVar66 - lVar53;
                lVar61 = 0;
                iVar41 = ((uint)local_638 * iVar44 - local_318[0]) + 2;
                iVar57 = (auStack_62c[0] - (uint)local_638) + 1;
                do {
                  lVar2 = local_338[0] + lVar38 * local_338[1] * 8 + (long)iVar41 * 8;
                  dVar86 = *(double *)(lVar2 + lVar45 * 8 + lVar43 * 8);
                  lVar3 = local_338[0] + (lVar38 + 1) * local_338[1] * 8 + (long)iVar41 * 8;
                  dVar92 = *(double *)(lVar3 + lVar45 * 8 + lVar43 * 8);
                  dVar80 = *(double *)(lVar65 + -8 + lVar61);
                  dVar83 = *(double *)(lVar35 + -8 + lVar61);
                  dVar84 = *(double *)(lVar39 + -8 + lVar61);
                  dVar4 = *(double *)(lVar39 + lVar61);
                  dVar71 = *(double *)(lVar37 + -8 + lVar61);
                  dVar94 = *(double *)(lVar37 + lVar61);
                  dVar5 = *(double *)(local_5d8 + -8 + lVar61);
                  dVar6 = *(double *)(local_5d8 + lVar61);
                  dVar7 = *(double *)(lVar1 + -8 + lVar61);
                  dVar8 = *(double *)(lVar1 + lVar61);
                  dVar87 = ((dVar84 + dVar94) - dVar71) - dVar4;
                  dVar16 = dVar82 * dVar87;
                  auVar14._8_4_ = SUB84(dVar5,0);
                  auVar14._0_8_ = dVar84;
                  auVar14._12_4_ = (int)((ulong)dVar5 >> 0x20);
                  dVar73 = ((dVar5 + dVar8) - dVar7) - dVar6;
                  dVar17 = dVar79 * dVar73;
                  dVar9 = *(double *)(lVar3 + lVar36 * 8 + lVar43 * 8);
                  dVar10 = *(double *)(lVar63 + -8 + lVar61);
                  dVar11 = *(double *)(lVar54 + -8 + lVar61);
                  dVar12 = *(double *)(lVar2 + lVar36 * 8 + lVar43 * 8);
                  dVar73 = dVar73 * dVar82;
                  dVar87 = dVar87 * dVar79;
                  dVar76 = ((dVar10 + dVar9) - dVar11) - dVar12;
                  dVar91 = SUB168(*(undefined1 (*) [16])(lVar67 + lVar61),0);
                  dVar93 = SUB168(*(undefined1 (*) [16])(lVar67 + lVar61),8);
                  dVar22 = *(double *)(local_650 + lVar61);
                  dVar23 = ((double *)(local_650 + lVar61))[1];
                  dVar20 = ((dVar22 + dVar93) - dVar91) - dVar23;
                  dVar70 = dVar81 * dVar20;
                  dVar24 = *(double *)(local_5e0 + lVar61);
                  dVar25 = ((double *)(local_5e0 + lVar61))[1];
                  dVar26 = *(double *)(lVar34 + lVar61);
                  dVar27 = ((double *)(lVar34 + lVar61))[1];
                  dVar88 = ((dVar26 + dVar25) - dVar24) - dVar27;
                  dVar74 = dVar89 * dVar88;
                  *(double *)(lVar65 + lVar61) =
                       (dVar80 + dVar86) * 0.5 + dVar16 + dVar17 + dVar70 + dVar74;
                  dVar88 = dVar88 * dVar81;
                  *(double *)(lVar35 + lVar61) =
                       (((dVar22 + dVar93) - dVar23) - dVar91) * dVar89 +
                       (dVar83 + dVar92) * 0.5 + dVar16 + dVar17 + dVar88;
                  *(double *)(lVar63 + lVar61) =
                       dVar70 + (dVar10 + dVar12) * 0.5 + dVar73 + dVar87 + dVar74;
                  dStack_460 = auVar18._8_8_;
                  *(double *)(lVar54 + lVar61) =
                       dVar20 * dVar89 + dVar88 + (dVar11 + dVar9) * 0.5 + dVar73 + dVar87;
                  dVar17 = ((dVar84 + dVar7) - dVar5) - dVar71;
                  dStack_4f0 = auVar14._8_8_;
                  dVar73 = ((dVar80 + dVar92) - dVar83) - dVar86;
                  dVar20 = dVar77 * dVar73;
                  dVar70 = dVar77 * dVar76;
                  dVar5 = ((dVar22 + dVar24) - dVar91) - dVar26;
                  dVar16 = ((dVar23 + dVar25) - dVar93) - dVar27;
                  *(double *)(local_670 + lVar61) =
                       dVar78 * dVar16 +
                       dVar19 * dVar5 + dVar76 * dVar90 + (dVar71 + dVar84) * 0.5 + dVar20;
                  ((double *)(local_670 + lVar61))[1] =
                       dVar78 * dVar5 +
                       dStack_460 * dVar16 + dVar76 * dVar90 + (dVar7 + dStack_4f0) * 0.5 + dVar20;
                  dVar84 = dVar5 * dVar78 +
                           dVar16 * dVar19 + dVar73 * dVar90 + (dVar8 + dVar6) * 0.5 + dVar70;
                  auVar15._8_4_ = SUB84(dVar84,0);
                  auVar15._0_8_ =
                       dVar16 * dVar78 +
                       dVar5 * dStack_460 + dVar73 * dVar90 + (dVar94 + dVar4) * 0.5 + dVar70;
                  auVar15._12_4_ = (int)((ulong)dVar84 >> 0x20);
                  *(undefined1 (*) [16])(lVar55 + lVar61) = auVar15;
                  dVar86 = ((dVar80 + dVar12) - dVar10) - dVar86;
                  dVar71 = dVar69 * dVar86;
                  dVar92 = ((dVar83 + dVar9) - dVar11) - dVar92;
                  dVar84 = dVar75 * dVar92;
                  dVar80 = dVar85 * dVar17;
                  dVar94 = ((dVar4 + dVar8) - dVar6) - dVar94;
                  dVar83 = dVar72 * dVar94;
                  *(double *)(local_5d0 + -8 + lVar61) =
                       (dVar22 + dVar91) * 0.5 + dVar71 + dVar84 + dVar80 + dVar83;
                  dVar94 = dVar94 * dVar85;
                  dVar17 = dVar17 * dVar72;
                  *(double *)(local_5c8 + -8 + lVar61) =
                       (dVar26 + dVar24) * 0.5 + dVar71 + dVar84 + dVar94 + dVar17;
                  dVar92 = dVar92 * dVar69;
                  dVar86 = dVar86 * dVar75;
                  *(double *)(local_5d0 + lVar61) =
                       (dVar23 + dVar93) * 0.5 + dVar92 + dVar86 + dVar80 + dVar83;
                  *(double *)(local_5c8 + lVar61) =
                       (dVar27 + dVar25) * 0.5 + dVar92 + dVar86 + dVar94 + dVar17;
                  iVar41 = iVar41 + iVar44;
                  lVar61 = lVar61 + (long)iVar44 * 8;
                  iVar57 = iVar57 + -1;
                } while (iVar57 != 0);
              }
              local_528 = local_528 + 1;
              local_5e0 = local_5e0 + lVar64;
              lVar34 = lVar34 + lVar64;
              local_670 = local_670 + lVar59;
              lVar67 = lVar67 + lVar64;
              local_650 = local_650 + lVar64;
              lVar54 = lVar54 + lVar46;
              lVar35 = lVar35 + lVar46;
              lVar63 = lVar63 + lVar46;
              lVar65 = lVar65 + lVar46;
              local_5c8 = local_5c8 + lVar64;
              local_5d0 = local_5d0 + lVar64;
              iVar29 = iVar29 + iVar40;
              local_5d8 = local_5d8 + lVar59;
              lVar39 = lVar39 + lVar59;
              lVar55 = lVar55 + lVar59;
            } while (auStack_62c[1] + 1 != (int)local_528);
          }
          local_508 = local_508 + iVar40;
          local_504 = local_504 + iVar40;
          local_500 = local_500 + iVar40;
          local_4fc = local_4fc + iVar40;
          bVar68 = uVar28 != (uint)local_624;
          uVar28 = uVar28 + 1;
        } while (bVar68);
      }
      local_3f8 = local_3f8 + 1;
      local_340 = local_340 + lVar31;
      local_360 = (undefined1  [8])((long)local_360 + lVar62);
      local_350 = (undefined1  [8])((long)local_350 + lVar31);
      local_378 = local_378 + local_338[3] * 8;
      local_380 = local_380 + local_338[3] * 8;
      local_348 = (undefined1  [8])((long)local_348 + lVar31);
      local_358 = (undefined1  [8])((long)local_358 + lVar31);
      local_368 = (undefined1  [8])((long)local_368 + lVar62);
      local_370 = local_370 + lVar62;
    } while (local_3f8 != uVar32);
  }
  return;
}

Assistant:

void
FaceDivFree::interp_arr (Array<FArrayBox*, AMREX_SPACEDIM> const& crse,
                         const int         crse_comp,
                         Array<FArrayBox*, AMREX_SPACEDIM> const& fine,
                         const int         fine_comp,
                         const int         ncomp,
                         const Box&        fine_region,
                         const IntVect&    ratio,
                         Array<IArrayBox*, AMREX_SPACEDIM> const& solve_mask,
                         const Geometry&   /*crse_geom */,
                         const Geometry&   fine_geom,
                         Vector<Array<BCRec, AMREX_SPACEDIM> > const& /*bcr*/,
                         const int         /*actual_comp*/,
                         const int         /*actual_state*/,
                         const RunOn       runon)
{
    BL_PROFILE("FaceDivFree::interp()");

    Array<IndexType, AMREX_SPACEDIM> types;
    for (int d=0; d<AMREX_SPACEDIM; ++d)
        { types[d].set(d); }

    // This is currently only designed for octree, where ratio = 2.
    AMREX_ALWAYS_ASSERT(ratio == 2);

    const Box c_fine_region = amrex::coarsen(fine_region, ratio);
    GpuArray<Real, AMREX_SPACEDIM> cell_size = fine_geom.CellSizeArray();

    GpuArray<Array4<const Real>, AMREX_SPACEDIM> crsearr;
    GpuArray<Array4<Real>, AMREX_SPACEDIM> finearr;
    GpuArray<Array4<const int>, AMREX_SPACEDIM> maskarr;
    for (int d=0; d<AMREX_SPACEDIM; ++d)
    {
        crsearr[d] = crse[d]->const_array(crse_comp);
        finearr[d] = fine[d]->array(fine_comp);
        if (solve_mask[d] != nullptr)
            { maskarr[d] = solve_mask[d]->const_array(0); }
    }

    // Fuse the launches, 1 for each dimension, into a single launch.
    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM_FLAG(runon,
              amrex::convert(c_fine_region,types[0]), bx0,
              {
                  AMREX_LOOP_3D(bx0, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          amrex::facediv_face_interp<Real> (i,j,k,crse_comp+n,fine_comp+n, 0,
                                                            crsearr[0], finearr[0], maskarr[0], ratio);
                      }
                  });
              },
              amrex::convert(c_fine_region,types[1]), bx1,
              {
                  AMREX_LOOP_3D(bx1, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          amrex::facediv_face_interp<Real> (i,j,k,crse_comp+n,fine_comp+n, 1,
                                                            crsearr[1], finearr[1], maskarr[1], ratio);
                      }
                  });
              },
              amrex::convert(c_fine_region,types[2]), bx2,
              {
                  AMREX_LOOP_3D(bx2, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          amrex::facediv_face_interp<Real> (i,j,k,crse_comp+n,fine_comp+n, 2,
                                                            crsearr[2], finearr[2], maskarr[2], ratio);
                      }
                  });
              });

    AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,c_fine_region,ncomp,i,j,k,n,
    {
        amrex::facediv_int<Real>(i, j, k, fine_comp+n, finearr, ratio, cell_size);
    });
}